

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutPt * ClipperLib::GetBottomPt(OutPt *pp)

{
  bool bVar1;
  OutPt *local_20;
  OutPt *p;
  OutPt *dups;
  OutPt *pp_local;
  
  p = (OutPt *)0x0;
  dups = pp;
  for (local_20 = pp->next; local_20 != dups; local_20 = local_20->next) {
    if ((dups->pt).Y < (local_20->pt).Y) {
      dups = local_20;
      p = (OutPt *)0x0;
    }
    else if (((local_20->pt).Y == (dups->pt).Y) && ((local_20->pt).X <= (dups->pt).X)) {
      if ((local_20->pt).X < (dups->pt).X) {
        p = (OutPt *)0x0;
        dups = local_20;
      }
      else if ((local_20->next != dups) && (local_20->prev != dups)) {
        p = local_20;
      }
    }
  }
  if (p != (OutPt *)0x0) {
    while (p != local_20) {
      bVar1 = FirstIsBottomPt(local_20,p);
      if (!bVar1) {
        dups = p;
      }
      p = p->next;
      while (bVar1 = PointsEqual(&p->pt,&dups->pt), ((bVar1 ^ 0xffU) & 1) != 0) {
        p = p->next;
      }
    }
  }
  return dups;
}

Assistant:

OutPt* GetBottomPt(OutPt *pp)
{
  OutPt* dups = 0;
  OutPt* p = pp->next;
  while (p != pp)
  {
    if (p->pt.Y > pp->pt.Y)
    {
      pp = p;
      dups = 0;
    }
    else if (p->pt.Y == pp->pt.Y && p->pt.X <= pp->pt.X)
    {
      if (p->pt.X < pp->pt.X)
      {
        dups = 0;
        pp = p;
      } else
      {
        if (p->next != pp && p->prev != pp) dups = p;
      }
    }
    p = p->next;
  }
  if (dups)
  {
    //there appears to be at least 2 vertices at bottomPt so ...
    while (dups != p)
    {
      if (!FirstIsBottomPt(p, dups)) pp = dups;
      dups = dups->next;
      while (!PointsEqual(dups->pt, pp->pt)) dups = dups->next;
    }
  }
  return pp;
}